

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listenable_impl.hpp
# Opt level: O0

void __thiscall
wigwag::detail::
listenable_impl<std::function<void(CollectionOp,int_const&,std::__cxx11::string_const&)>,wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>
::handler_node_with_attributes::
handler_node_with_attributes<wigwag::detail::intrusive_ptr<wigwag::detail::listenable_impl<std::function<void(CollectionOp,int_const&,std::__cxx11::string_const&)>,wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>>&,std::function<void(CollectionOp,int_const&,std::__cxx11::string_const&)>>
          (handler_node_with_attributes *this,handler_attributes attributes,
          intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
          *args,function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *args_1)

{
  function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_50;
  intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
  local_30;
  function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *local_28;
  function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *args_local_1;
  intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
  *args_local;
  handler_node_with_attributes *phStack_10;
  handler_attributes attributes_local;
  handler_node_with_attributes *this_local;
  
  local_28 = args_1;
  args_local_1 = (function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)args;
  args_local._4_4_ = attributes;
  phStack_10 = this;
  intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
  ::intrusive_ptr(&local_30,args);
  std::
  function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_50,local_28);
  listenable_impl<std::function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
  ::handler_node::handler_node((handler_node *)this,&local_30,&local_50);
  std::
  function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_50);
  intrusive_ptr<wigwag::detail::listenable_impl<std::function<void_(CollectionOp,_const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
  ::~intrusive_ptr(&local_30);
  *(undefined ***)this = &PTR_release_token_impl_0015c990;
  *(undefined ***)(this + 8) = &PTR__handler_node_with_attributes_0015c9c0;
  *(handler_attributes *)(this + 0x50) = args_local._4_4_;
  return;
}

Assistant:

handler_node_with_attributes(handler_attributes attributes, Args_&&... args)
                : handler_node(std::forward<Args_>(args)...), _attributes(attributes)
            { }